

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O2

void Lsp_Az(tetra_codec *st,Word16 *lsp,Word16 *a)

{
  Word32 L_var2;
  Word32 WVar1;
  Word32 WVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  Word32 f2 [6];
  Word32 f1 [6];
  
  Get_Lsp_Pol(st,lsp,f1);
  Get_Lsp_Pol(st,lsp + 1,f2);
  for (lVar5 = 0; lVar5 != -5; lVar5 = lVar5 + -1) {
    uVar4 = (int)lVar5 + 4;
    WVar1 = L_add(st,f1[lVar5 + 5],f1[uVar4]);
    f1[lVar5 + 5] = WVar1;
    WVar1 = L_sub(st,f2[lVar5 + 5],f2[uVar4]);
    f2[lVar5 + 5] = WVar1;
  }
  *a = 0x1000;
  lVar5 = 0x14;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 2) {
    WVar1 = *(Word32 *)((long)f1 + lVar3 * 2 + 4);
    L_var2 = *(Word32 *)((long)f2 + lVar3 * 2 + 4);
    WVar2 = L_add(st,WVar1,L_var2);
    WVar2 = L_shr_r(st,WVar2,0xd);
    *(short *)((long)a + lVar3 + 2) = (short)WVar2;
    WVar1 = L_sub(st,WVar1,L_var2);
    WVar1 = L_shr_r(st,WVar1,0xd);
    *(short *)((long)a + lVar5) = (short)WVar1;
    lVar5 = lVar5 + -2;
  }
  return;
}

Assistant:

void Lsp_Az(tetra_codec* st, Word16 lsp[], Word16 a[])
{
  Word16 i, j;
  Word32 f1[6], f2[6];
  Word32 t0;

  Get_Lsp_Pol(st, &lsp[0],f1);
  Get_Lsp_Pol(st, &lsp[1],f2);

  for (i = 5; i > 0; i--)
  {
    f1[i] = L_add(st, f1[i], f1[i-1]);			/* f1[i] += f1[i-1]; */
    f2[i] = L_sub(st, f2[i], f2[i-1]);			/* f2[i] -= f2[i-1]; */
  }

  a[0] = 4096;
  for (i = 1, j = 10; i <= 5; i++, j--)
  {
    t0   = L_add(st, f1[i], f2[i]);			/* f1[i] + f2[i] */
    a[i] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
    t0   = L_sub(st, f1[i], f2[i]);			/* f1[i] - f2[i] */
    a[j] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
  }

  return;
}